

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

void __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
::expand(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::Demodulation::Rhs>_>
         *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  UnresolvedSplitRecord *__ptr;
  undefined8 uVar3;
  UnresolvedSplitRecord *pUVar4;
  long lVar5;
  ulong uVar6;
  
  __ptr = this->_data;
  uVar6 = 4;
  if (this->_capacity != 0) {
    uVar6 = (ulong)(this->_capacity * 2);
  }
  this->_capacity = (uint)uVar6;
  pUVar4 = (UnresolvedSplitRecord *)Lib::alloc(uVar6 << 4);
  this->_data = pUVar4;
  this->_data1 = pUVar4 + -1;
  if ((ulong)this->_size != 0) {
    lVar5 = (ulong)this->_size << 4;
    do {
      puVar1 = (undefined8 *)((long)&__ptr[-1].var + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pUVar4[-1].var + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar5 = lVar5 + -0x10;
    } while (lVar5 != 0);
  }
  if (__ptr != (UnresolvedSplitRecord *)0x0) {
    Lib::free(__ptr);
    return;
  }
  return;
}

Assistant:

void expand()
  {
    ASS(_capacity==_size);

    unsigned oldCapacity=_capacity;
    T* oldData=_data;

    _capacity= _capacity ? _capacity*2 : 4;

    void* mem = ALLOC_KNOWN(_capacity*sizeof(T),"BinaryHeap::T");
    _data = static_cast<T*>(mem);
    _data1 = _data-1;

    if(_size) {
      T* otp = oldData+_size;
      T* ntp = _data+_size;
      do {
	::new (--ntp) T(*(--otp));
	//because oldCapacity==_size, we destroy all elements of oldData array here
	otp->~T();
      } while(ntp!=_data);
    }

    if(oldData) {
      DEALLOC_KNOWN(oldData,oldCapacity*sizeof(T),"BinaryHeap::T");
    }
  }